

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

int get_prediction_error_bitdepth
              (int is_high_bitdepth,int bitdepth,BLOCK_SIZE block_size,buf_2d *src,buf_2d *ref)

{
  buf_2d *in_RCX;
  undefined4 in_ESI;
  int in_EDI;
  buf_2d *in_R8;
  int in_stack_ffffffffffffffdc;
  BLOCK_SIZE bsize;
  undefined4 local_4;
  
  bsize = (BLOCK_SIZE)((uint)in_ESI >> 0x18);
  if (in_EDI == 0) {
    local_4 = get_prediction_error(bsize,in_RCX,in_R8);
  }
  else {
    local_4 = highbd_get_prediction_error(bsize,in_RCX,in_R8,in_stack_ffffffffffffffdc);
  }
  return local_4;
}

Assistant:

static int get_prediction_error_bitdepth(const int is_high_bitdepth,
                                         const int bitdepth,
                                         const BLOCK_SIZE block_size,
                                         const struct buf_2d *src,
                                         const struct buf_2d *ref) {
  (void)is_high_bitdepth;
  (void)bitdepth;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_high_bitdepth) {
    return highbd_get_prediction_error(block_size, src, ref, bitdepth);
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  return get_prediction_error(block_size, src, ref);
}